

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateGetPrototype
          (ServiceGenerator *this,RequestOrResponse which,Printer *printer)

{
  long lVar1;
  allocator<char> local_2f7;
  allocator<char> local_2f6;
  allocator<char> local_2f5;
  RequestOrResponse which_local;
  undefined1 *local_2f0;
  undefined8 local_2e8;
  undefined1 local_2e0 [8];
  undefined8 uStack_2d8;
  Printer *printer_local;
  _Any_data local_2c8;
  code *local_2b8;
  code *pcStack_2b0;
  char *local_2a8;
  string local_2a0;
  char *local_280;
  string local_278;
  Sub local_258 [2];
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  which_local = which;
  printer_local = printer;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"which",&local_2f5);
  local_280 = "FooResponse";
  if (which == kRequest) {
    local_280 = "FooRequest";
  }
  local_280 = local_280 + 3;
  io::Printer::Sub::Sub<char_const*>(local_258,&local_278,&local_280);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"which_type",&local_2f6);
  local_2a8 = "output";
  if (which == kRequest) {
    local_2a8 = "input";
  }
  io::Printer::Sub::Sub<char_const*>(local_258 + 1,&local_2a0,&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"cases",&local_2f7);
  local_e8 = local_d8;
  if (local_2f0 == local_2e0) {
    uStack_d0 = uStack_2d8;
  }
  else {
    local_e8 = local_2f0;
  }
  local_e0 = local_2e8;
  local_2e8 = 0;
  local_2e0[0] = 0;
  local_2b8 = (code *)0x0;
  pcStack_2b0 = (code *)0x0;
  local_2c8._M_unused._M_object = (void *)0x0;
  local_2c8._8_8_ = 0;
  local_2f0 = local_2e0;
  local_2c8._M_unused._M_object = operator_new(0x20);
  *(ServiceGenerator **)local_2c8._M_unused._0_8_ = this;
  *(RequestOrResponse **)((long)local_2c8._M_unused._0_8_ + 8) = &which_local;
  *(Printer ***)((long)local_2c8._M_unused._0_8_ + 0x10) = &printer_local;
  *(code *)((long)local_2c8._M_unused._0_8_ + 0x18) = (code)0x0;
  pcStack_2b0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_2b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_c8,(function<bool_()> *)&local_2c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_2c8);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  if (local_a8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_a0);
  }
  local_38 = 0;
  io::Printer::Emit(printer,local_258,3,0x1fa,
                    "\n        const $pb$::Message& $classname$::Get$which$Prototype(\n            const $pb$::MethodDescriptor* $nonnull$ method) const {\n          ABSL_DCHECK_EQ(method->service(), descriptor());\n          switch (method->index()) {\n            $cases$;\n\n            default:\n              ABSL_LOG(FATAL) << \"Bad method index; this should never happen.\";\n              return *$pb$::MessageFactory::generated_factory()->GetPrototype(\n                  method->$which_type$_type());\n          }\n        }\n      "
                   );
  lVar1 = 0x170;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_258[0].key_._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0xb8;
  } while (lVar1 != -0xb8);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_278);
  return;
}

Assistant:

void ServiceGenerator::GenerateGetPrototype(RequestOrResponse which,
                                            io::Printer* printer) {
  printer->Emit(
      {
          {"which", which == kRequest ? "Request" : "Response"},
          {"which_type", which == kRequest ? "input" : "output"},
          {"cases",
           [&] {
             for (int i = 0; i < descriptor_->method_count(); ++i) {
               const MethodDescriptor* method = descriptor_->method(i);
               const Descriptor* type = which == kRequest
                                            ? method->input_type()
                                            : method->output_type();

               printer->Emit(
                   {
                       {"index", absl::StrCat(i)},
                       {"type", QualifiedClassName(type, *options_)},
                   },
                   R"cc(
                     case $index$:
                       return $type$::default_instance();
                   )cc");
             }
           }},
      },
      R"cc(
        const $pb$::Message& $classname$::Get$which$Prototype(
            const $pb$::MethodDescriptor* $nonnull$ method) const {
          ABSL_DCHECK_EQ(method->service(), descriptor());
          switch (method->index()) {
            $cases$;

            default:
              ABSL_LOG(FATAL) << "Bad method index; this should never happen.";
              return *$pb$::MessageFactory::generated_factory()->GetPrototype(
                  method->$which_type$_type());
          }
        }
      )cc");
}